

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O2

void Gia_ManSimPatSimAnd(Gia_Man_t *p,int i,Gia_Obj_t *pObj,int nWords,Vec_Wrd_t *vSims)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  undefined4 in_register_0000000c;
  ulong uVar9;
  int iVar10;
  undefined4 in_register_00000034;
  
  uVar9 = *(ulong *)CONCAT44(in_register_00000034,i);
  uVar3 = *(ulong *)((long)Cnf_CutDeriveTruth::C + (ulong)((uint)(uVar9 >> 0x1a) & 8));
  uVar6 = (uint)(uVar9 >> 0x20);
  uVar4 = Cnf_CutDeriveTruth::C[uVar6 >> 0x1d & 1];
  lVar5 = *(long *)(CONCAT44(in_register_0000000c,nWords) + 8);
  iVar7 = (int)p;
  iVar10 = (int)pObj;
  lVar1 = lVar5 + (long)(int)((iVar7 - ((uint)uVar9 & 0x1fffffff)) * iVar10) * 8;
  lVar2 = lVar5 + (long)(int)((iVar7 - (uVar6 & 0x1fffffff)) * iVar10) * 8;
  lVar5 = lVar5 + (long)(iVar10 * iVar7) * 8;
  iVar7 = Gia_ObjIsXor((Gia_Obj_t *)CONCAT44(in_register_00000034,i));
  uVar9 = 0;
  if (0 < iVar10) {
    uVar9 = (ulong)pObj & 0xffffffff;
  }
  if (iVar7 == 0) {
    for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      *(ulong *)(lVar5 + uVar8 * 8) =
           (*(ulong *)(lVar2 + uVar8 * 8) ^ uVar4) & (*(ulong *)(lVar1 + uVar8 * 8) ^ uVar3);
    }
  }
  else {
    for (uVar8 = 0; uVar9 != uVar8; uVar8 = uVar8 + 1) {
      *(ulong *)(lVar5 + uVar8 * 8) =
           *(ulong *)(lVar1 + uVar8 * 8) ^ *(ulong *)(lVar2 + uVar8 * 8) ^ uVar3 ^ uVar4;
    }
  }
  return;
}

Assistant:

static inline void Gia_ManSimPatSimAnd( Gia_Man_t * p, int i, Gia_Obj_t * pObj, int nWords, Vec_Wrd_t * vSims )
{
    word pComps[2] = { 0, ~(word)0 };
    word Diff0 = pComps[Gia_ObjFaninC0(pObj)];
    word Diff1 = pComps[Gia_ObjFaninC1(pObj)];
    word * pSims  = Vec_WrdArray(vSims);
    word * pSims0 = pSims + nWords*Gia_ObjFaninId0(pObj, i);
    word * pSims1 = pSims + nWords*Gia_ObjFaninId1(pObj, i);
    word * pSims2 = pSims + nWords*i; int w;
    if ( Gia_ObjIsXor(pObj) )
        for ( w = 0; w < nWords; w++ )
            pSims2[w] = (pSims0[w] ^ Diff0) ^ (pSims1[w] ^ Diff1);
    else
        for ( w = 0; w < nWords; w++ )
            pSims2[w] = (pSims0[w] ^ Diff0) & (pSims1[w] ^ Diff1);
}